

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string filepath;
  string warning;
  ifstream matIStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  long *local_3e0;
  size_type local_3d8;
  long local_3d0 [2];
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  uint auStack_218 [122];
  
  paVar1 = &local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  sVar3 = (this->m_mtlBaseDir)._M_string_length;
  local_400._M_dataplus._M_p = (pointer)paVar1;
  if (sVar3 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_400,matId);
  }
  else {
    local_3c0._0_8_ = local_3c0 + 0x10;
    pcVar4 = (this->m_mtlBaseDir)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_3c0,pcVar4,pcVar4 + sVar3);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c0,(matId->_M_dataplus)._M_p,matId->_M_string_length);
    local_238._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p == paVar7) {
      local_238.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_238._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_400,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
      operator_delete((void *)local_3c0._0_8_,
                      CONCAT71(local_3b0[0]._M_allocated_capacity._1_7_,local_3b0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  std::ifstream::ifstream(&local_238,local_400._M_dataplus._M_p,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
  if ((uVar2 & 5) == 0) {
    local_3c0._8_8_ = 0;
    local_3b0[0]._M_local_buf[0] = '\0';
    local_3c0._0_8_ = local_3c0 + 0x10;
    LoadMtl(matMap,materials,(istream *)&local_238,(string *)local_3c0);
    if (err != (string *)0x0 && local_3c0._8_8_ != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (err,(char *)local_3c0._0_8_,local_3c0._8_8_);
    }
    if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
      operator_delete((void *)local_3c0._0_8_,
                      CONCAT71(local_3b0[0]._M_allocated_capacity._1_7_,local_3b0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_3c0 + 0x10),"WARN: Material file [ ",0x16);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_3c0 + 0x10),local_400._M_dataplus._M_p,
                        local_400._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ] not found.",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (err,(char *)local_3e0,local_3d8);
      if (local_3e0 != local_3d0) {
        operator_delete(local_3e0,local_3d0[0] + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar1) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  return (uVar2 & 5) == 0;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *err) {
  std::string filepath;

  if (!m_mtlBaseDir.empty()) {
    filepath = std::string(m_mtlBaseDir) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath << " ] not found." << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &matIStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}